

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

ContainerScanState * __thiscall
duckdb::roaring::RoaringScanState::LoadContainer
          (RoaringScanState *this,idx_t container_index,idx_t internal_offset)

{
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> _Var1;
  bool bVar2;
  ContainerMetadata CVar3;
  type pCVar4;
  pointer pCVar5;
  unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> _Var6;
  RoaringScanState *this_01;
  data_ptr_t segments;
  idx_t number_of_runs;
  data_ptr_t data_ptr;
  unsigned_long container_size;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> local_58;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> local_50;
  ContainerScanState *local_48;
  idx_t local_40;
  ulong local_38;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> local_30;
  
  local_40 = container_index;
  bVar2 = UseContainerStateCache(this,container_index,internal_offset);
  if (bVar2) {
    pCVar4 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
             ::operator*(&this->current_container);
    return pCVar4;
  }
  CVar3 = GetContainerMetadata(this,container_index);
  local_48 = (ContainerScanState *)GetStartOfContainerData(this,container_index);
  local_38 = (this->segment->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i + local_40 * -0x800;
  if (0x7ff < local_38) {
    local_38 = 0x800;
  }
  if (CVar3.container_type == RUN_CONTAINER) {
    local_50._M_head_impl = (ContainerScanState *)(ulong)((uint)CVar3 >> 0x10);
    if (0x3ffff < (uint)CVar3) {
      local_58._M_head_impl = local_48;
      local_48 = (ContainerScanState *)&local_48->container_index;
      make_uniq<duckdb::roaring::CompressedRunContainerScanState,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char*&,unsigned_char*&>
                ((duckdb *)&local_30,&local_40,&local_38,(unsigned_long *)&local_50,
                 (uchar **)&local_58,(uchar **)&local_48);
      goto LAB_0049d634;
    }
    make_uniq<duckdb::roaring::RunContainerScanState,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char*&>
              ((duckdb *)&local_58,&local_40,&local_38,(unsigned_long *)&local_50,
               (uchar **)&local_48);
LAB_0049d65a:
    _Var1._M_head_impl = local_58._M_head_impl;
    local_58._M_head_impl = (ContainerScanState *)0x0;
    _Var6._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    if (_Var6._M_head_impl == (ContainerScanState *)0x0) goto LAB_0049d683;
    (**(code **)((long)(_Var6._M_head_impl)->_vptr_ContainerScanState + 8))();
    _Var6._M_head_impl = local_58._M_head_impl;
  }
  else if (((uint)CVar3 & 0xff) == 2) {
    local_58._M_head_impl = local_48;
    make_uniq<duckdb::roaring::BitsetContainerScanState,unsigned_long&,unsigned_long&,unsigned_long*>
              ((duckdb *)&local_50,&local_40,&local_38,(unsigned_long **)&local_58);
    _Var1._M_head_impl = local_50._M_head_impl;
    local_50._M_head_impl = (ContainerScanState *)0x0;
    _Var6._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    if (_Var6._M_head_impl == (ContainerScanState *)0x0) goto LAB_0049d683;
    (**(code **)((long)(_Var6._M_head_impl)->_vptr_ContainerScanState + 8))();
    _Var6._M_head_impl = local_50._M_head_impl;
  }
  else {
    local_50._M_head_impl = (ContainerScanState *)(ulong)((uint)CVar3 >> 0x10);
    if ((uint)CVar3 < 0x80000) {
      if (((uint)CVar3 >> 8 & 1) == 0) {
        make_uniq<duckdb::roaring::ArrayContainerScanState<false>,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char*&>
                  ((duckdb *)&local_58,&local_40,&local_38,(unsigned_long *)&local_50,
                   (uchar **)&local_48);
      }
      else {
        make_uniq<duckdb::roaring::ArrayContainerScanState<true>,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char*&>
                  ((duckdb *)&local_58,&local_40,&local_38,(unsigned_long *)&local_50,
                   (uchar **)&local_48);
      }
      goto LAB_0049d65a;
    }
    if (((uint)CVar3 >> 8 & 1) == 0) {
      local_58._M_head_impl = local_48;
      local_48 = (ContainerScanState *)&local_48->container_index;
      make_uniq<duckdb::roaring::CompressedArrayContainerScanState<false>,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char*&,unsigned_char*&>
                ((duckdb *)&local_30,&local_40,&local_38,(unsigned_long *)&local_50,
                 (uchar **)&local_58,(uchar **)&local_48);
    }
    else {
      local_58._M_head_impl = local_48;
      local_48 = (ContainerScanState *)&local_48->container_index;
      make_uniq<duckdb::roaring::CompressedArrayContainerScanState<true>,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char*&,unsigned_char*&>
                ((duckdb *)&local_30,&local_40,&local_38,(unsigned_long *)&local_50,
                 (uchar **)&local_58,(uchar **)&local_48);
    }
LAB_0049d634:
    _Var1._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (ContainerScanState *)0x0;
    _Var6._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    if (_Var6._M_head_impl == (ContainerScanState *)0x0) goto LAB_0049d683;
    (**(code **)((long)(_Var6._M_head_impl)->_vptr_ContainerScanState + 8))();
    _Var6._M_head_impl = local_30._M_head_impl;
  }
  if (_Var6._M_head_impl != (ContainerScanState *)0x0) {
    (*(_Var6._M_head_impl)->_vptr_ContainerScanState[1])();
  }
LAB_0049d683:
  this_00 = &this->current_container;
  pCVar5 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator->(this_00);
  (*pCVar5->_vptr_ContainerScanState[4])(pCVar5);
  this_01 = (RoaringScanState *)this_00;
  pCVar4 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator*(this_00);
  if (internal_offset != 0) {
    Skip(this_01,pCVar4,internal_offset);
  }
  pCVar4 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator*(this_00);
  return pCVar4;
}

Assistant:

ContainerScanState &RoaringScanState::LoadContainer(idx_t container_index, idx_t internal_offset) {
	if (UseContainerStateCache(container_index, internal_offset)) {
		return *current_container;
	}
	auto metadata = GetContainerMetadata(container_index);
	auto data_ptr = GetStartOfContainerData(container_index);

	auto segment_count = segment.count.load();
	auto start_of_container = container_index * ROARING_CONTAINER_SIZE;
	auto container_size = MinValue<idx_t>(segment_count - start_of_container, ROARING_CONTAINER_SIZE);
	if (metadata.IsUncompressed()) {
		current_container = make_uniq<BitsetContainerScanState>(container_index, container_size,
		                                                        reinterpret_cast<validity_t *>(data_ptr));
	} else if (metadata.IsRun()) {
		D_ASSERT(metadata.IsInverted());
		auto number_of_runs = metadata.NumberOfRuns();
		if (number_of_runs >= COMPRESSED_RUN_THRESHOLD) {
			auto segments = data_ptr;
			data_ptr = segments + COMPRESSED_SEGMENT_COUNT;
			current_container = make_uniq<CompressedRunContainerScanState>(container_index, container_size,
			                                                               number_of_runs, segments, data_ptr);
		} else {
			D_ASSERT(AlignValue<sizeof(RunContainerRLEPair)>(data_ptr) == data_ptr);
			current_container =
			    make_uniq<RunContainerScanState>(container_index, container_size, number_of_runs, data_ptr);
		}
	} else {
		auto cardinality = metadata.Cardinality();
		if (cardinality >= COMPRESSED_ARRAY_THRESHOLD) {
			auto segments = data_ptr;
			data_ptr = segments + COMPRESSED_SEGMENT_COUNT;
			if (metadata.IsInverted()) {
				current_container = make_uniq<CompressedArrayContainerScanState<NULLS>>(
				    container_index, container_size, cardinality, segments, data_ptr);
			} else {
				current_container = make_uniq<CompressedArrayContainerScanState<NON_NULLS>>(
				    container_index, container_size, cardinality, segments, data_ptr);
			}
		} else {
			D_ASSERT(AlignValue<sizeof(uint16_t)>(data_ptr) == data_ptr);
			if (metadata.IsInverted()) {
				current_container =
				    make_uniq<ArrayContainerScanState<NULLS>>(container_index, container_size, cardinality, data_ptr);
			} else {
				current_container = make_uniq<ArrayContainerScanState<NON_NULLS>>(container_index, container_size,
				                                                                  cardinality, data_ptr);
			}
		}
	}

	current_container->Verify();

	auto &scan_state = *current_container;
	if (internal_offset) {
		Skip(scan_state, internal_offset);
	}
	return *current_container;
}